

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b8a13::CAPIBuildSystemFrontendDelegate::commandFoundDiscoveredDependency
          (CAPIBuildSystemFrontendDelegate *this,Command *command,StringRef path,
          DiscoveredDependencyKind kind)

{
  _func_void_void_ptr_llb_buildsystem_command_t_ptr_char_ptr_llb_buildsystem_discovered_dependency_kind_t
  *p_Var1;
  void *pvVar2;
  char *pcVar3;
  string local_50;
  DiscoveredDependencyKind local_2c;
  Command *pCStack_28;
  DiscoveredDependencyKind kind_local;
  Command *command_local;
  CAPIBuildSystemFrontendDelegate *this_local;
  StringRef path_local;
  
  path_local.Data = (char *)path.Length;
  this_local = (CAPIBuildSystemFrontendDelegate *)path.Data;
  if ((this->cAPIDelegate).command_found_discovered_dependency !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_char_ptr_llb_buildsystem_discovered_dependency_kind_t
       *)0x0) {
    p_Var1 = (this->cAPIDelegate).command_found_discovered_dependency;
    pvVar2 = (this->cAPIDelegate).context;
    local_2c = kind;
    pCStack_28 = command;
    command_local = (Command *)this;
    llvm::StringRef::str_abi_cxx11_(&local_50,(StringRef *)&this_local);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    (*p_Var1)(pvVar2,(llb_buildsystem_command_t *)command,pcVar3,local_2c);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

virtual void commandFoundDiscoveredDependency(Command* command, StringRef path, DiscoveredDependencyKind kind) override {
    if (cAPIDelegate.command_found_discovered_dependency) {
      cAPIDelegate.command_found_discovered_dependency(
          cAPIDelegate.context,
          (llb_buildsystem_command_t*) command,
          path.str().c_str(),
          (llb_buildsystem_discovered_dependency_kind_t) kind);
    }
  }